

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedLPCMTrackData::ParsedLPCMTrackData(ParsedLPCMTrackData *this,MatroskaTrack *track)

{
  ushort channels;
  uint16_t bitdepth;
  pointer puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer puVar7;
  allocator<char> local_5a;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  (this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedLPCMTrackData_0024b010;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_waveBuffer).m_size = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,track->codec_id,&local_59);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"/BIG",&local_5a);
  bVar6 = strEndWith(&local_38,&local_58);
  this->m_convertBytes = bVar6;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  channels = *(ushort *)&track->field_0x84;
  this->m_channels = channels;
  bitdepth = *(uint16_t *)&track->field_0x86;
  this->m_bitdepth = bitdepth;
  wave_format::buildWaveHeader
            (&this->m_waveBuffer,*(int *)&track[1].field_0x4,channels,5 < channels,bitdepth);
  if (track->codec_priv_size == 0x28) {
    puVar1 = (this->m_waveBuffer).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (pointer)0x0;
    if (puVar1 != (this->m_waveBuffer).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar7 = puVar1;
    }
    puVar2 = track->codec_priv;
    *(undefined8 *)(puVar7 + 0x34) = *(undefined8 *)(puVar2 + 0x20);
    uVar3 = *(undefined8 *)puVar2;
    uVar4 = *(undefined8 *)(puVar2 + 8);
    uVar5 = *(undefined8 *)(puVar2 + 0x18);
    *(undefined8 *)(puVar7 + 0x24) = *(undefined8 *)(puVar2 + 0x10);
    *(undefined8 *)(puVar7 + 0x2c) = uVar5;
    *(undefined8 *)(puVar7 + 0x14) = uVar3;
    *(undefined8 *)(puVar7 + 0x1c) = uVar4;
  }
  return;
}

Assistant:

ParsedLPCMTrackData::ParsedLPCMTrackData(MatroskaTrack* track)
    : ParsedTrackPrivData(track->codec_priv, track->codec_priv_size)
{
    m_convertBytes = strEndWith(track->codec_id, "/BIG");
    const auto audiotrack = reinterpret_cast<MatroskaAudioTrack*>(track);
    m_channels = audiotrack->channels;
    m_bitdepth = audiotrack->bitdepth;

    buildWaveHeader(m_waveBuffer, audiotrack->samplerate, m_channels, m_channels >= 6, m_bitdepth);

    if (track->codec_priv_size == sizeof(WAVEFORMATPCMEX))
        memcpy(m_waveBuffer.data() + 20, track->codec_priv, track->codec_priv_size);
}